

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O0

bool IsInSideParametricDomain<pzgeom::TPZGeoPrism>(int side,TPZVec<double> *pt,REAL tol)

{
  ostream *poVar1;
  TPZVec<double> *in_RSI;
  int in_EDI;
  REAL in_XMM0_Qa;
  stringstream sout;
  MElementType type;
  undefined4 in_stack_00000214;
  REAL in_stack_fffffffffffffdf0;
  TPZVec<double> *in_stack_fffffffffffffdf8;
  REAL in_stack_fffffffffffffe00;
  TPZVec<double> *in_stack_fffffffffffffe08;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [380];
  MElementType local_1c;
  REAL local_18;
  TPZVec<double> *local_10;
  byte local_1;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_1c = pztopology::TPZPrism::Type(in_EDI);
  switch(local_1c) {
  case EPoint:
    local_1 = pztopology::TPZPoint::IsInParametricDomain(local_10,local_18);
    break;
  case EOned:
    local_1 = pztopology::TPZLine::IsInParametricDomain
                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    break;
  case ETriangle:
    local_1 = pztopology::TPZTriangle::IsInParametricDomain
                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    break;
  case EQuadrilateral:
    local_1 = pztopology::TPZQuadrilateral::IsInParametricDomain
                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    break;
  case ETetraedro:
    local_1 = pztopology::TPZTetrahedron::IsInParametricDomain
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    break;
  case EPiramide:
    local_1 = pztopology::TPZPyramid::IsInParametricDomain
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    break;
  case EPrisma:
    local_1 = pztopology::TPZPrism::IsInParametricDomain
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    break;
  case ECube:
    local_1 = pztopology::TPZCube::IsInParametricDomain
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,"Fatal error at ");
    poVar1 = std::operator<<(poVar1,
                             "bool IsInSideParametricDomain(int, const TPZVec<REAL> &, REAL) [Topology = pzgeom::TPZGeoPrism]"
                            );
    poVar1 = std::operator<<(poVar1," - Element type ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    std::operator<<(poVar1," not found");
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    std::__cxx11::stringstream::str();
    poVar1 = std::operator<<(poVar1,local_1d8);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_1d8);
    pzinternal::DebugStopImpl((char *)CONCAT44(in_stack_00000214,side),(size_t)pt);
    local_1 = 0;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool IsInSideParametricDomain(int side, const TPZVec<REAL> &pt, REAL tol){
    MElementType type = Topology::Type(side);
    switch(type){
        case EPoint:
            return pztopology::TPZPoint::IsInParametricDomain(pt,tol);
        case EOned:
            return pztopology::TPZLine::IsInParametricDomain(pt,tol);
        case ETriangle:
            return pztopology::TPZTriangle::IsInParametricDomain(pt,tol);
        case EQuadrilateral:
            return pztopology::TPZQuadrilateral::IsInParametricDomain(pt,tol);
            
        case ETetraedro:
            return pztopology::TPZTetrahedron::IsInParametricDomain(pt,tol);
            
        case EPiramide:
            return pztopology::TPZPyramid::IsInParametricDomain(pt,tol);
            
        case EPrisma:
            return pztopology::TPZPrism::IsInParametricDomain(pt,tol);
            
        case ECube:
            return pztopology::TPZCube::IsInParametricDomain(pt,tol);
            
        default:
            std::stringstream sout;
            sout << "Fatal error at " << __PRETTY_FUNCTION__ << " - Element type " << type << " not found";
            PZError << "\n" << sout.str() << "\n";
            DebugStop();
            return false;
            break;
    }//case
    
    return false;
}